

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrapMode.cpp
# Opt level: O0

Function * wasm::generateBinaryFunc(Module *wasm,Binary *curr)

{
  Signature sig;
  initializer_list<wasm::Type> types;
  BinaryOp BVar1;
  UnaryOp op_00;
  int init;
  LocalGet *pLVar2;
  LocalGet *right;
  long init_00;
  Const *pCVar3;
  Binary *pBVar4;
  Binary *right_00;
  Unary *condition;
  If *pIVar5;
  pointer pFVar6;
  optional<wasm::Type> type_00;
  optional<wasm::Type> type_01;
  Name name;
  undefined1 local_1e8 [12];
  Literal local_1d8;
  uintptr_t local_1c0;
  vector<wasm::Type,_std::allocator<wasm::Type>_> local_1b8;
  uintptr_t local_198;
  uintptr_t uStack_190;
  HeapType local_180;
  string_view local_178;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> local_168;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> func;
  Type local_158;
  uintptr_t local_150;
  iterator local_148;
  undefined8 local_140;
  Type local_138;
  undefined1 auStack_130 [8];
  Signature funcSig;
  undefined1 local_118 [12];
  Literal local_108;
  Literal local_f0;
  uintptr_t local_d8;
  Literal local_d0;
  uintptr_t local_b8;
  undefined1 local_b0 [8];
  Literal negLit;
  BinaryOp eqOp;
  undefined1 local_88 [8];
  Literal zeroLit;
  Literal minLit;
  UnaryOp eqZOp;
  BinaryOp divSIntOp;
  Binary *local_40;
  Expression *result;
  Builder builder;
  Type TStack_28;
  bool isI64;
  Type type;
  BinaryOp op;
  Binary *curr_local;
  Module *wasm_local;
  
  type.id._4_4_ = curr->op;
  TStack_28.id = (curr->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id
  ;
  builder.wasm._0_4_ = 3;
  builder.wasm._7_1_ = Type::operator==(&stack0xffffffffffffffd8,(BasicType *)&builder);
  Builder::Builder((Builder *)&result,wasm);
  BVar1 = type.id._4_4_;
  pLVar2 = Builder::makeLocalGet((Builder *)&result,0,TStack_28);
  right = Builder::makeLocalGet((Builder *)&result,1,TStack_28);
  local_40 = Builder::makeBinary((Builder *)&result,BVar1,(Expression *)pLVar2,(Expression *)right);
  BVar1 = DivSInt32;
  if ((builder.wasm._7_1_ & 1) != 0) {
    BVar1 = DivSInt64;
  }
  op_00 = EqZInt32;
  if ((builder.wasm._7_1_ & 1) != 0) {
    op_00 = EqZInt64;
  }
  if ((builder.wasm._7_1_ & 1) == 0) {
    init = std::numeric_limits<int>::min();
    Literal::Literal((Literal *)&zeroLit.type,init);
  }
  else {
    init_00 = std::numeric_limits<long>::min();
    Literal::Literal((Literal *)&zeroLit.type,init_00);
  }
  if ((builder.wasm._7_1_ & 1) == 0) {
    Literal::Literal((Literal *)local_88,0);
  }
  else {
    Literal::Literal((Literal *)local_88,0);
  }
  if (type.id._4_4_ == BVar1) {
    negLit.type.id._0_4_ = EqInt32;
    if ((builder.wasm._7_1_ & 1) != 0) {
      negLit.type.id._0_4_ = EqInt64;
    }
    if ((builder.wasm._7_1_ & 1) == 0) {
      Literal::Literal((Literal *)local_b0,-1);
    }
    else {
      Literal::Literal((Literal *)local_b0,-1);
    }
    BVar1 = (BinaryOp)negLit.type.id;
    local_b8 = TStack_28.id;
    pLVar2 = Builder::makeLocalGet((Builder *)&result,0,TStack_28);
    Literal::Literal(&local_d0,(Literal *)&zeroLit.type);
    pCVar3 = Builder::makeConst((Builder *)&result,&local_d0);
    pBVar4 = Builder::makeBinary((Builder *)&result,BVar1,(Expression *)pLVar2,(Expression *)pCVar3)
    ;
    BVar1 = (BinaryOp)negLit.type.id;
    local_d8 = TStack_28.id;
    pLVar2 = Builder::makeLocalGet((Builder *)&result,1,TStack_28);
    Literal::Literal(&local_f0,(Literal *)local_b0);
    pCVar3 = Builder::makeConst((Builder *)&result,&local_f0);
    right_00 = Builder::makeBinary((Builder *)&result,BVar1,(Expression *)pLVar2,
                                   (Expression *)pCVar3);
    pBVar4 = Builder::makeBinary((Builder *)&result,AndInt32,(Expression *)pBVar4,
                                 (Expression *)right_00);
    Literal::Literal(&local_108,(Literal *)local_88);
    pCVar3 = Builder::makeConst((Builder *)&result,&local_108);
    std::optional<wasm::Type>::optional((optional<wasm::Type> *)local_118);
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._12_4_ = 0;
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload =
         (_Storage<wasm::Type,_true>)local_118._0_8_;
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_118[8];
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._9_3_ = local_118._9_3_;
    local_40 = (Binary *)
               Builder::makeIf((Builder *)&result,(Expression *)pBVar4,(Expression *)pCVar3,
                               (Expression *)local_40,type_00);
    Literal::~Literal(&local_108);
    Literal::~Literal(&local_f0);
    Literal::~Literal(&local_d0);
    Literal::~Literal((Literal *)local_b0);
  }
  local_158.id = TStack_28.id;
  local_150 = TStack_28.id;
  local_148 = &local_158;
  local_140 = 2;
  types._M_len = 2;
  types._M_array = local_148;
  Type::Type(&local_138,types);
  func._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
       (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
       TStack_28.id;
  Signature::Signature((Signature *)auStack_130,local_138,TStack_28);
  local_178 = (string_view)getBinaryFuncName(curr);
  local_198 = (uintptr_t)auStack_130;
  uStack_190 = funcSig.params.id;
  sig.results.id = funcSig.params.id;
  sig.params.id = (uintptr_t)auStack_130;
  HeapType::HeapType(&local_180,sig);
  local_1b8.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b8.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector(&local_1b8);
  name.super_IString.str._M_str = (char *)local_178._M_len;
  name.super_IString.str._M_len = (size_t)&local_168;
  Builder::makeFunction
            (name,(HeapType)local_178._M_str,
             (vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_180.id,
             (Expression *)&local_1b8);
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector(&local_1b8);
  local_1c0 = TStack_28.id;
  pLVar2 = Builder::makeLocalGet((Builder *)&result,1,TStack_28);
  condition = Builder::makeUnary((Builder *)&result,op_00,(Expression *)pLVar2);
  Literal::Literal(&local_1d8,(Literal *)local_88);
  pCVar3 = Builder::makeConst((Builder *)&result,&local_1d8);
  std::optional<wasm::Type>::optional((optional<wasm::Type> *)local_1e8);
  type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._12_4_ = 0;
  type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)local_1e8._0_8_;
  type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_1e8[8];
  type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._9_3_ = local_1e8._9_3_;
  pIVar5 = Builder::makeIf((Builder *)&result,(Expression *)condition,(Expression *)pCVar3,
                           (Expression *)local_40,type_01);
  pFVar6 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                     (&local_168);
  pFVar6->body = (Expression *)pIVar5;
  Literal::~Literal(&local_1d8);
  pFVar6 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::release
                     (&local_168);
  std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr(&local_168);
  Literal::~Literal((Literal *)local_88);
  Literal::~Literal((Literal *)&zeroLit.type);
  return pFVar6;
}

Assistant:

Function* generateBinaryFunc(Module& wasm, Binary* curr) {
  BinaryOp op = curr->op;
  Type type = curr->type;
  bool isI64 = type == Type::i64;
  Builder builder(wasm);
  Expression* result = builder.makeBinary(
    op, builder.makeLocalGet(0, type), builder.makeLocalGet(1, type));
  BinaryOp divSIntOp = isI64 ? DivSInt64 : DivSInt32;
  UnaryOp eqZOp = isI64 ? EqZInt64 : EqZInt32;
  Literal minLit = isI64 ? Literal(std::numeric_limits<int64_t>::min())
                         : Literal(std::numeric_limits<int32_t>::min());
  Literal zeroLit = isI64 ? Literal(int64_t(0)) : Literal(int32_t(0));
  if (op == divSIntOp) {
    // guard against signed division overflow
    BinaryOp eqOp = isI64 ? EqInt64 : EqInt32;
    Literal negLit = isI64 ? Literal(int64_t(-1)) : Literal(int32_t(-1));
    result = builder.makeIf(
      builder.makeBinary(
        AndInt32,
        builder.makeBinary(
          eqOp, builder.makeLocalGet(0, type), builder.makeConst(minLit)),
        builder.makeBinary(
          eqOp, builder.makeLocalGet(1, type), builder.makeConst(negLit))),
      builder.makeConst(zeroLit),
      result);
  }
  auto funcSig = Signature({type, type}, type);
  auto func = Builder::makeFunction(getBinaryFuncName(curr), funcSig, {});
  func->body =
    builder.makeIf(builder.makeUnary(eqZOp, builder.makeLocalGet(1, type)),
                   builder.makeConst(zeroLit),
                   result);
  // TODO: use unique_ptr properly and do not release ownership.
  return func.release();
}